

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Node * __thiscall wasm::DataFlow::Graph::doVisitGeneric(Graph *this,Expression *curr)

{
  Index IVar1;
  Expression **ppEVar2;
  Node *pNVar3;
  AbstractChildIterator<wasm::ChildIterator> *pAVar4;
  Iterator IVar5;
  AbstractChildIterator<wasm::ChildIterator> local_88;
  Expression *local_48;
  Iterator local_40;
  
  local_48 = curr;
  AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_88,curr);
  local_40.index = 0;
  local_40.parent = &local_88;
  IVar5 = AbstractChildIterator<wasm::ChildIterator>::end(&local_88);
  IVar1 = 0;
  pAVar4 = &local_88;
  while ((IVar1 != IVar5.index || (pAVar4 != IVar5.parent))) {
    ppEVar2 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_40);
    Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
              ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,*ppEVar2);
    IVar1 = local_40.index + 1;
    pAVar4 = local_40.parent;
    local_40.index = IVar1;
  }
  std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
            (&local_88.children.flexible.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>);
  pNVar3 = makeVar(this,(Type)(local_48->type).id);
  return pNVar3;
}

Assistant:

Node* doVisitGeneric(Expression* curr) {
    // Just need to visit the nodes so we note all the gets
    for (auto* child : ChildIterator(curr)) {
      visit(child);
    }
    return makeVar(curr->type);
  }